

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::matrix3d> *value)

{
  bool bVar1;
  matrix3d v;
  matrix3d local_60;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    local_60.m[0][0] = 1.0;
    local_60.m[1][0] = 0.0;
    local_60.m[0][1] = 0.0;
    local_60.m[0][2] = 0.0;
    local_60.m[1][1] = 1.0;
    local_60.m[1][2] = 0.0;
    local_60.m[2][0] = 0.0;
    local_60.m[2][1] = 0.0;
    local_60.m[2][2] = 1.0;
    bVar1 = ParseMatrix(this,&local_60);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::matrix3d>::operator=(value,&local_60);
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::matrix3d> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::matrix3d v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}